

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

int64_t dtl_sv_to_i64(dtl_sv_t *self,_Bool *ok)

{
  dtl_sv_type_id dVar1;
  ulong local_28;
  int64_t retval;
  _Bool success;
  _Bool *ok_local;
  dtl_sv_t *self_local;
  
  retval._7_1_ = false;
  local_28 = 0;
  if (self != (dtl_sv_t *)0x0) {
    dVar1 = dtl_sv_type(self);
    switch(dVar1) {
    case DTL_SV_NONE:
      break;
    case DTL_SV_I32:
      local_28 = (ulong)(self->pAny->val).i32;
      retval._7_1_ = true;
      break;
    case DTL_SV_U32:
      local_28 = (ulong)(self->pAny->val).u32;
      retval._7_1_ = true;
      break;
    case DTL_SV_I64:
      local_28 = (self->pAny->val).i64;
      retval._7_1_ = true;
      break;
    case DTL_SV_U64:
      retval._7_1_ = (self->pAny->val).u64 < 0x8000000000000000;
      if (retval._7_1_) {
        local_28 = (self->pAny->val).i64;
      }
      break;
    case DTL_SV_FLT:
      local_28 = (ulong)(self->pAny->val).flt;
      retval._7_1_ = true;
      break;
    case DTL_SV_DBL:
      local_28 = (ulong)(self->pAny->val).dbl;
      retval._7_1_ = true;
      break;
    case DTL_SV_CHAR:
      local_28 = (ulong)(self->pAny->val).cr;
      retval._7_1_ = true;
      break;
    case DTL_SV_BOOL:
      local_28 = (ulong)((self->pAny->val).cr & 1);
      retval._7_1_ = true;
      break;
    case DTL_SV_STR:
      break;
    case DTL_SV_PTR:
      break;
    case DTL_SV_DV:
      break;
    case DTL_SV_BYTES:
      break;
    case DTL_SV_BYTEARRAY:
    }
  }
  if (ok != (_Bool *)0x0) {
    *ok = retval._7_1_;
  }
  return local_28;
}

Assistant:

int64_t dtl_sv_to_i64(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   int64_t retval = 0u;

   if(self != 0)
   {
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         retval = (int32_t)self->pAny->val.i32;
         success = true;
         break;
      case DTL_SV_U32:
         retval = (int64_t) self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_I64:
         retval = (int64_t)self->pAny->val.i64;
         success = true;
         break;
      case DTL_SV_U64:
         if (self->pAny->val.u64 <= INT64_MAX)
         {
            retval = (int64_t)self->pAny->val.i64;
            success = true;
         }
         break;
     case DTL_SV_FLT:
         retval = (int64_t) self->pAny->val.flt;
         success = true;
         break;
      case DTL_SV_DBL:
         retval = (int64_t) self->pAny->val.dbl;
         success = true;
         break;
     case DTL_SV_BOOL:
         retval = (int64_t) self->pAny->val.bl;
         success = true;
         break;
     case DTL_SV_CHAR:
        retval = (int64_t)self->pAny->val.cr;
        success = true;
        break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}